

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O1

Raster * rw::d3d::rasterCreate(Raster *raster)

{
  uint uVar1;
  int32 numlevels;
  long lVar2;
  undefined8 uVar3;
  void *pvVar4;
  Raster *pRVar5;
  uint32 usage;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  if ((raster->format == 0) && ((raster->type & 0xfffffffbU) == 0)) {
    raster->format = 0x500;
  }
  lVar2 = (long)nativeRasterOffset;
  uVar1 = raster->format;
  if ((uVar1 & 0x6000) == 0) {
    uVar7 = (ulong)(uVar1 >> 4 & 0xf0);
    iVar6 = *(int *)(formatInfoRW + uVar7 + 4);
    *(undefined4 *)((long)&raster->height + lVar2) = *(undefined4 *)(formatInfoRW + uVar7);
  }
  else {
    *(undefined4 *)((long)&raster->height + lVar2) = 0x29;
    iVar6 = 8;
  }
  iVar8 = iVar6 + 7;
  if (-1 < iVar6) {
    iVar8 = iVar6;
  }
  raster->depth = iVar6;
  *(int *)((long)&raster->depth + lVar2) = iVar8 >> 3;
  *(bool *)((long)&raster->stride + lVar2) = (0x2aU >> (uVar1 >> 8 & 0xf) & 1) != 0;
  iVar6 = raster->width;
  raster->stride = (iVar8 >> 3) * iVar6;
  usage = ~uVar1;
  *(bool *)((long)&raster->stride + lVar2 + 2) = (usage & 0x9000) == 0;
  pRVar5 = raster;
  if ((iVar6 == 0) || (raster->height == 0)) {
    *(byte *)&raster->flags = (byte)raster->flags | 0x80;
    raster->stride = 0;
  }
  else if ((raster->flags & 0x80) == 0) {
    if ((raster->type & 0xfffffffbU) != 0) {
      rasterCreate();
      return (Raster *)0x0;
    }
    lVar2 = (long)nativeRasterOffset;
    if (*(int *)((long)&raster->height + lVar2) == 0x29) {
      usage = 0x149ef8;
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d.cpp line: 419"
      ;
      uVar3 = (*DAT_00149da8)(0x400,0x30b00);
      *(undefined8 *)((long)&raster->flags + lVar2) = uVar3;
    }
    numlevels = 0;
    if ((*(char *)((long)&raster->stride + lVar2 + 2) == '\0') &&
       (numlevels = 1, (raster->format & 0x8000) != 0)) {
      numlevels = Raster::calculateNumLevels(raster->width,raster->height);
    }
    pvVar4 = createTexture(raster->width,raster->height,numlevels,usage,
                           *(uint32 *)((long)&raster->height + lVar2));
    *(void **)((long)&raster->platform + lVar2) = pvVar4;
    if (pvVar4 == (void *)0x0) {
      rasterCreate();
      pRVar5 = (Raster *)0x0;
    }
  }
  raster->originalWidth = raster->width;
  raster->originalHeight = raster->height;
  raster->originalStride = raster->stride;
  raster->originalPixels = raster->pixels;
  return pRVar5;
}

Assistant:

Raster*
rasterCreate(Raster *raster)
{
	rasterSetFormat(raster);

	Raster *ret = raster;

	if(raster->width == 0 || raster->height == 0){
		raster->flags |= Raster::DONTALLOCATE;
		raster->stride = 0;
		goto ret;
	}
	if(raster->flags & Raster::DONTALLOCATE)
		goto ret;

	switch(raster->type){
	case Raster::NORMAL:
	case Raster::TEXTURE:
		ret = rasterCreateTexture(raster);
		break;

#ifdef RW_D3D9
	case Raster::CAMERATEXTURE:
		ret = rasterCreateCameraTexture(raster);
		break;
	case Raster::ZBUFFER:
		ret = rasterCreateZbuffer(raster);
		break;
	case Raster::CAMERA:
		ret = rasterCreateCamera(raster);
		break;
#endif

	default:
		RWERROR((ERR_INVRASTER));
		return nil;
	}

ret:
	raster->originalWidth = raster->width;
	raster->originalHeight = raster->height;
	raster->originalStride = raster->stride;
	raster->originalPixels = raster->pixels;
	return ret;
}